

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O2

void __thiscall
capnp::compiler::Declaration::Builder::adoptNakedId
          (Builder *this,Orphan<capnp::compiler::LocatedInteger> *value)

{
  PointerBuilder local_18;
  
  *(undefined2 *)((long)(this->_builder).data + 2) = 0xc;
  local_18.pointer = (this->_builder).pointers + 5;
  local_18.segment = (this->_builder).segment;
  local_18.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::adopt(&local_18,&value->builder);
  return;
}

Assistant:

inline void Declaration::Builder::adoptNakedId(
    ::capnp::Orphan< ::capnp::compiler::LocatedInteger>&& value) {
  _builder.setDataField<Declaration::Which>(
      ::capnp::bounded<1>() * ::capnp::ELEMENTS, Declaration::NAKED_ID);
  ::capnp::_::PointerHelpers< ::capnp::compiler::LocatedInteger>::adopt(_builder.getPointerField(
      ::capnp::bounded<5>() * ::capnp::POINTERS), kj::mv(value));
}